

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::SynchronizationTests::init(SynchronizationTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Context *pCVar2;
  ReadData RVar3;
  SynchronizationTests *pSVar4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  TestNode *pTVar7;
  InvocationAliasWriteCase *pIVar8;
  TestNode *node;
  InterCallTestCase *pIVar9;
  TestCase *pTVar10;
  long lVar11;
  uint flags;
  value_type *pvVar12;
  WriteDataInterleaved *pWVar13;
  WriteData *cmd;
  int iVar14;
  char *pcVar15;
  allocator<char> local_1a1;
  InvocationConfig *local_1a0;
  TestNode *local_198;
  TestNode *local_190;
  char *local_188;
  SynchronizationTests *local_180;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  InvocationAliasWriteCase *local_130;
  string local_128;
  InterCallTestCase *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  value_type local_d8;
  TestNode *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  WriteDataInterleaved local_78;
  TestNode *local_68;
  bool local_60;
  ReadData local_58;
  TestNode *local_50;
  long local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  local_50 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_50,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "in_invocation","Test intra-invocation synchronization");
  local_40 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_40,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "inter_invocation","Test inter-invocation synchronization");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"inter_call",
             "Test inter-call synchronization");
  tcu::TestNode::addChild((TestNode *)this,local_50);
  tcu::TestNode::addChild((TestNode *)this,local_40);
  local_180 = this;
  local_38 = pTVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pIVar9 = (InterCallTestCase *)0x0;
  while (iVar14 = (int)pIVar9, iVar14 != 2) {
    local_198 = local_40;
    if (iVar14 == 0) {
      local_198 = local_50;
    }
    local_48 = CONCAT44(local_48._4_4_,(uint)(iVar14 != 0) << 2);
    lVar11 = 0;
    local_100 = pIVar9;
    while (lVar11 != 0x40) {
      iVar14 = *(int *)((long)&init::configs[0].storage + lVar11);
      local_1a0 = (InvocationConfig *)CONCAT44(local_1a0._4_4_,iVar14);
      local_c0 = (TestNode *)0x80498e;
      if (iVar14 == 0) {
        local_c0 = (TestNode *)0x83052a;
      }
      local_130 = (InvocationAliasWriteCase *)operator_new(0xa8);
      pCVar2 = (local_180->super_TestCaseGroup).m_context;
      local_188 = *(char **)((long)&init::configs[0].namePrefix + lVar11);
      local_190 = (TestNode *)lVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,local_188,(allocator<char> *)&local_128);
      std::operator+(&local_150,&local_98,"_write_read");
      _Var5._M_p = local_150._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Write to ",(allocator<char> *)&local_d8);
      std::operator+(&local_b8,&local_f8,(char *)local_c0);
      std::operator+(&local_170,&local_b8," and read it");
      pIVar8 = local_130;
      flags = *(uint *)((long)&init::configs[0].flags + (long)local_190) | (uint)local_48;
      anon_unknown_1::InvocationBasicCase::InvocationBasicCase
                ((InvocationBasicCase *)local_130,pCVar2,_Var5._M_p,local_170._M_dataplus._M_p,
                 (StorageType)local_1a0,flags);
      *(undefined ***)&pIVar8->super_InterInvocationTestCase =
           &PTR__InterInvocationTestCase_00a10218;
      tcu::TestNode::addChild(local_198,(TestNode *)pIVar8);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      pTVar7 = (TestNode *)operator_new(0xa8);
      pCVar2 = (local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,local_188,(allocator<char> *)&local_128);
      std::operator+(&local_150,&local_98,"_read_write");
      _Var5._M_p = local_150._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Read form ",(allocator<char> *)&local_d8);
      std::operator+(&local_b8,&local_f8,(char *)local_c0);
      std::operator+(&local_170,&local_b8," and then write to it");
      anon_unknown_1::InvocationBasicCase::InvocationBasicCase
                ((InvocationBasicCase *)pTVar7,pCVar2,_Var5._M_p,local_170._M_dataplus._M_p,
                 (StorageType)local_1a0,flags);
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__InterInvocationTestCase_00a10330;
      tcu::TestNode::addChild(local_198,pTVar7);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      pTVar7 = (TestNode *)operator_new(0xa8);
      pCVar2 = (local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,local_188,(allocator<char> *)&local_128);
      std::operator+(&local_150,&local_98,"_overwrite");
      _Var5._M_p = local_150._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Write to ",(allocator<char> *)&local_d8);
      std::operator+(&local_b8,&local_f8,(char *)local_c0);
      std::operator+(&local_170,&local_b8," twice and read it");
      anon_unknown_1::InvocationBasicCase::InvocationBasicCase
                ((InvocationBasicCase *)pTVar7,pCVar2,_Var5._M_p,local_170._M_dataplus._M_p,
                 (StorageType)local_1a0,flags);
      pTVar7->_vptr_TestNode = (_func_int **)&PTR__InterInvocationTestCase_00a10390;
      tcu::TestNode::addChild(local_198,pTVar7);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      pIVar8 = (InvocationAliasWriteCase *)operator_new(0xb0);
      pCVar2 = (local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,local_188,(allocator<char> *)&local_128);
      std::operator+(&local_150,&local_98,"_alias_write");
      _Var5._M_p = local_150._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Write to aliasing ",(allocator<char> *)&local_d8);
      std::operator+(&local_b8,&local_f8,(char *)local_c0);
      std::operator+(&local_170,&local_b8," and read it");
      anon_unknown_1::InvocationAliasWriteCase::InvocationAliasWriteCase
                (pIVar8,pCVar2,_Var5._M_p,local_170._M_dataplus._M_p,TYPE_WRITE,
                 (StorageType)local_1a0,flags);
      tcu::TestNode::addChild(local_198,(TestNode *)pIVar8);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      local_130 = (InvocationAliasWriteCase *)operator_new(0xb0);
      pCVar2 = (local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,local_188,(allocator<char> *)&local_128);
      std::operator+(&local_150,&local_98,"_alias_overwrite");
      _Var5._M_p = local_150._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Write to aliasing ",(allocator<char> *)&local_d8);
      std::operator+(&local_b8,&local_f8,(char *)local_c0);
      std::operator+(&local_170,&local_b8,"s and read it");
      pIVar8 = local_130;
      anon_unknown_1::InvocationAliasWriteCase::InvocationAliasWriteCase
                (local_130,pCVar2,_Var5._M_p,local_170._M_dataplus._M_p,TYPE_OVERWRITE,
                 (StorageType)local_1a0,flags);
      tcu::TestNode::addChild(local_198,(TestNode *)pIVar8);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      lVar11 = (long)local_190 + 0x10;
    }
    pIVar9 = (InterCallTestCase *)(ulong)((int)local_100 + 1);
  }
  local_190 = (TestNode *)operator_new(0x70);
  pSVar4 = local_180;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_190,
             (local_180->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "with_memory_barrier","Synchronize with memory barrier");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (pSVar4->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "without_memory_barrier","Synchronize without memory barrier");
  pTVar7 = local_38;
  tcu::TestNode::addChild(local_38,local_190);
  local_c0 = node;
  tcu::TestNode::addChild(pTVar7,node);
  lVar11 = 0;
  while (lVar11 != 0x40) {
    iVar14 = *(int *)((long)&init()::configs[0].storage + lVar11);
    local_198 = (TestNode *)CONCAT44(local_198._4_4_,iVar14);
    local_1a0 = (InvocationConfig *)0x80498e;
    if (iVar14 == 0) {
      local_1a0 = (InvocationConfig *)0x83052a;
    }
    pIVar9 = (InterCallTestCase *)operator_new(0x108);
    pCVar2 = (local_180->super_TestCaseGroup).m_context;
    local_130 = *(InvocationAliasWriteCase **)((long)&init()::configs[0].namePrefix + lVar11);
    local_48 = lVar11;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)local_130,(allocator<char> *)&local_68);
    std::operator+(&local_150,&local_98,"_write_read");
    _Var6._M_p = local_150._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Write to ",(allocator<char> *)&local_58);
    std::operator+(&local_b8,&local_f8,(char *)local_1a0);
    std::operator+(&local_170,&local_b8," and read it");
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_188 = (char *)CONCAT44(local_188._4_4_,
                                 *(undefined4 *)((long)&init()::configs[0].flags + local_48));
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_d8._0_8_ = 0x7b00000001;
    pvVar12 = &local_d8;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)pvVar12);
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)pvVar12);
    local_78.targetHandle = 1;
    local_78.seed = 0x7b;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(ReadData *)&local_78);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar9,pCVar2,_Var6._M_p,_Var5._M_p,(StorageType)local_198,(int)local_188,
               (InterCallOperations *)&local_128);
    tcu::TestNode::addChild(local_190,(TestNode *)pIVar9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    pIVar9 = (InterCallTestCase *)operator_new(0x108);
    pCVar2 = (local_180->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)local_130,(allocator<char> *)&local_78);
    std::operator+(&local_150,&local_98,"_read_write");
    _Var6._M_p = local_150._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Read from ",(allocator<char> *)&local_68);
    std::operator+(&local_b8,&local_f8,(char *)local_1a0);
    std::operator+(&local_170,&local_b8," and then write to it");
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_d8._0_8_ = 0;
    local_d8.u_cmd._4_8_ = 0;
    local_d8.u_cmd.readMulti.seed1 = 0;
    pvVar12 = &local_d8;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)&local_128,pvVar12);
    *(undefined8 *)(local_128._M_string_length - 0x14) = 0x100000006;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)pvVar12);
    local_d8._0_8_ = 0x7b00000001;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)&local_d8);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar9,pCVar2,_Var6._M_p,_Var5._M_p,(StorageType)local_198,(int)local_188,
               (InterCallOperations *)&local_128);
    tcu::TestNode::addChild(local_190,(TestNode *)pIVar9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    pIVar9 = (InterCallTestCase *)operator_new(0x108);
    pCVar2 = (local_180->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)local_130,(allocator<char> *)&local_58);
    std::operator+(&local_150,&local_98,"_overwrite");
    _Var6._M_p = local_150._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Write to ",&local_1a1);
    std::operator+(&local_b8,&local_f8,(char *)local_1a0);
    std::operator+(&local_170,&local_b8," twice and read it");
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_d8._0_8_ = 0x7b00000001;
    pvVar12 = &local_d8;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)pvVar12);
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)pvVar12);
    local_78.targetHandle = 1;
    local_78.seed = 0x1c9;
    pWVar13 = &local_78;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)pWVar13);
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)pWVar13);
    local_68 = (TestNode *)0x1c900000001;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(ReadData *)&local_68);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar9,pCVar2,_Var6._M_p,_Var5._M_p,(StorageType)local_198,(int)local_188,
               (InterCallOperations *)&local_128);
    tcu::TestNode::addChild(local_190,(TestNode *)pIVar9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    local_100 = (InterCallTestCase *)operator_new(0x108);
    pCVar2 = (local_180->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)local_130,(allocator<char> *)&local_58);
    std::operator+(&local_150,&local_98,"_multiple_write_read");
    _Var6._M_p = local_150._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Write to multiple ",&local_1a1);
    std::operator+(&local_b8,&local_f8,(char *)local_1a0);
    std::operator+(&local_170,&local_b8,"s and read them");
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_78.targetHandle = 1;
    local_78.seed = 0x7b;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)&local_78);
    local_68 = (TestNode *)0x1c900000002;
    cmd = (WriteData *)&local_68;
    anon_unknown_1::InterCallOperations::operator<<((InterCallOperations *)&local_128,cmd);
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)cmd);
    pIVar9 = local_100;
    local_50 = (TestNode *)0x1c900000001;
    local_d8._0_8_ = 0;
    local_d8.u_cmd._4_8_ = 0;
    local_d8.u_cmd.readMulti.seed1 = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)&local_128,&local_d8);
    *(undefined4 *)(local_128._M_string_length - 0x14) = 3;
    *(undefined8 *)(local_128._M_string_length - 0x10) = 0x7b00000001;
    *(undefined8 *)(local_128._M_string_length - 8) = 0x1c900000002;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar9,pCVar2,_Var6._M_p,_Var5._M_p,(StorageType)local_198,(int)local_188,
               (InterCallOperations *)&local_128);
    tcu::TestNode::addChild(local_190,(TestNode *)pIVar9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    pIVar9 = (InterCallTestCase *)operator_new(0x108);
    pCVar2 = (local_180->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)local_130,(allocator<char> *)&local_58);
    std::operator+(&local_150,&local_98,"_multiple_interleaved_write_read");
    _Var6._M_p = local_150._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Write to same ",&local_1a1);
    std::operator+(&local_b8,&local_f8,(char *)local_1a0);
    std::operator+(&local_170,&local_b8," in multiple calls and read it");
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_128.field_2._M_allocated_capacity = 0;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_78.targetHandle = 1;
    local_78.seed = 0x7b;
    local_78.evenOdd = true;
    anon_unknown_1::InterCallOperations::operator<<((InterCallOperations *)&local_128,&local_78);
    local_68 = local_50;
    local_60 = false;
    pWVar13 = (WriteDataInterleaved *)&local_68;
    anon_unknown_1::InterCallOperations::operator<<((InterCallOperations *)&local_128,pWVar13);
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)pWVar13);
    local_d8._0_8_ = 0;
    local_d8.u_cmd._4_8_ = 0;
    local_d8.u_cmd.readMulti.seed1 = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                 *)&local_128,&local_d8);
    *(undefined4 *)(local_128._M_string_length - 0x14) = 5;
    *(undefined8 *)(local_128._M_string_length - 0x10) = 0x7b00000001;
    *(undefined4 *)(local_128._M_string_length - 8) = 0x1c9;
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar9,pCVar2,_Var6._M_p,_Var5._M_p,(StorageType)local_198,(int)local_188,
               (InterCallOperations *)&local_128);
    tcu::TestNode::addChild(local_190,(TestNode *)pIVar9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    pIVar9 = (InterCallTestCase *)operator_new(0x108);
    pCVar2 = (local_180->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)local_130,&local_1a1);
    std::operator+(&local_150,&local_98,"_multiple_unrelated_write_read_ordered");
    _Var6._M_p = local_150._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Two unrelated ",&local_171);
    std::operator+(&local_b8,&local_f8,(char *)local_1a0);
    std::operator+(&local_170,&local_b8," write-reads");
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_d8._0_8_ = 0x7b00000001;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)&local_d8);
    local_78.targetHandle = 2;
    local_78.seed = 0x1c9;
    pWVar13 = &local_78;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)pWVar13);
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)pWVar13);
    local_68 = (TestNode *)0x7b00000001;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(ReadData *)&local_68);
    local_58.targetHandle = 2;
    local_58.seed = 0x1c9;
    anon_unknown_1::InterCallOperations::operator<<((InterCallOperations *)&local_128,&local_58);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar9,pCVar2,_Var6._M_p,_Var5._M_p,(StorageType)local_198,(int)local_188,
               (InterCallOperations *)&local_128);
    tcu::TestNode::addChild(local_190,(TestNode *)pIVar9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    pIVar9 = (InterCallTestCase *)operator_new(0x108);
    pCVar2 = (local_180->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,(char *)local_130,&local_1a1);
    std::operator+(&local_150,&local_98,"_multiple_unrelated_write_read_non_ordered");
    _Var6._M_p = local_150._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Two unrelated ",&local_171);
    std::operator+(&local_b8,&local_f8,(char *)local_1a0);
    std::operator+(&local_170,&local_b8," write-reads");
    _Var5._M_p = local_170._M_dataplus._M_p;
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_d8._0_8_ = 0x7b00000001;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)&local_d8);
    local_78.targetHandle = 2;
    local_78.seed = 0x1c9;
    pWVar13 = &local_78;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(WriteData *)pWVar13);
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(Barrier *)pWVar13);
    local_68 = (TestNode *)0x1c900000002;
    anon_unknown_1::InterCallOperations::operator<<
              ((InterCallOperations *)&local_128,(ReadData *)&local_68);
    local_58.targetHandle = 1;
    local_58.seed = 0x7b;
    anon_unknown_1::InterCallOperations::operator<<((InterCallOperations *)&local_128,&local_58);
    anon_unknown_1::InterCallTestCase::InterCallTestCase
              (pIVar9,pCVar2,_Var6._M_p,_Var5._M_p,(StorageType)local_198,(int)local_188,
               (InterCallOperations *)&local_128);
    tcu::TestNode::addChild(local_190,(TestNode *)pIVar9);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
               *)&local_128);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    lVar11 = local_48 + 0x10;
  }
  for (local_190 = (TestNode *)0x0; local_190 != (TestNode *)0x3;
      local_190 = (TestNode *)((long)local_190 + 1)) {
    local_1a0 = init::ssboInvocations + (long)local_190;
    pcVar15 = (char *)0x0;
    while (pcVar15 != (char *)0xc) {
      pTVar10 = (TestCase *)operator_new(0xa8);
      RVar3 = (ReadData)(local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"ssbo_atomic_dispatch_",(allocator<char> *)&local_d8);
      local_198 = (TestNode *)RVar3;
      local_188 = pcVar15;
      de::toString<int>(&local_128,(int *)(pcVar15 + 0x81ab98));
      std::operator+(&local_b8,&local_f8,&local_128);
      std::operator+(&local_170,&local_b8,"_calls_");
      std::operator+(&local_98,&local_170,local_1a0->name);
      std::operator+(&local_150,&local_98,"_invocations");
      iVar14 = *(int *)(pcVar15 + 0x81ab98);
      iVar1 = local_1a0->count;
      TestCase::TestCase(pTVar10,(Context *)local_198,local_150._M_dataplus._M_p,
                         SSBOArrayLengthTests::init::arraysSized + 1);
      (pTVar10->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SSBOConcurrentAtomicCase_00a10498;
      *(int *)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode = iVar14;
      *(int *)((long)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar1;
      pTVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      *(undefined4 *)&pTVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
      pTVar10[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
      pTVar10[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&pTVar10[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      tcu::TestNode::addChild(local_c0,(TestNode *)pTVar10);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_f8);
      pcVar15 = local_188 + 4;
    }
  }
  for (local_190 = (TestNode *)0x0; local_190 != (TestNode *)0x3;
      local_190 = (TestNode *)((long)local_190 + 1)) {
    local_1a0 = init::imageInvocations + (long)local_190;
    pcVar15 = (char *)0x0;
    while (pcVar15 != (char *)0xc) {
      pTVar10 = (TestCase *)operator_new(0xb8);
      RVar3 = (ReadData)(local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"image_atomic_dispatch_",(allocator<char> *)&local_d8);
      local_198 = (TestNode *)RVar3;
      local_188 = pcVar15;
      de::toString<int>(&local_128,(int *)(pcVar15 + 0x81ab98));
      std::operator+(&local_b8,&local_f8,&local_128);
      std::operator+(&local_170,&local_b8,"_calls_");
      std::operator+(&local_98,&local_170,local_1a0->name);
      std::operator+(&local_150,&local_98,"_invocations");
      iVar14 = *(int *)(pcVar15 + 0x81ab98);
      iVar1 = local_1a0->count;
      TestCase::TestCase(pTVar10,(Context *)local_198,local_150._M_dataplus._M_p,
                         SSBOArrayLengthTests::init::arraysSized + 1);
      (pTVar10->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ConcurrentImageAtomicCase_00a104e8;
      *(int *)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode = iVar14;
      *(int *)((long)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar1;
      pTVar10[1].super_TestCase.super_TestNode.m_description._M_string_length = 0;
      *(undefined8 *)((long)&pTVar10[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
      pTVar10[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
      pTVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      pTVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      *(undefined8 *)((long)&pTVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
           0;
      *(undefined8 *)((long)&pTVar10[1].super_TestCase.super_TestNode.m_name._M_string_length + 4) =
           0;
      tcu::TestNode::addChild(local_c0,(TestNode *)pTVar10);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_f8);
      pcVar15 = local_188 + 4;
    }
  }
  for (local_190 = (TestNode *)0x0; local_190 != (TestNode *)0x3;
      local_190 = (TestNode *)((long)local_190 + 1)) {
    local_1a0 = init::counterInvocations + (long)local_190;
    pcVar15 = (char *)0x0;
    while (pcVar15 != (char *)0xc) {
      pTVar10 = (TestCase *)operator_new(0x98);
      RVar3 = (ReadData)(local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"atomic_counter_dispatch_",(allocator<char> *)&local_d8);
      local_198 = (TestNode *)RVar3;
      local_188 = pcVar15;
      de::toString<int>(&local_128,(int *)(pcVar15 + 0x81ab98));
      std::operator+(&local_b8,&local_f8,&local_128);
      std::operator+(&local_170,&local_b8,"_calls_");
      std::operator+(&local_98,&local_170,local_1a0->name);
      std::operator+(&local_150,&local_98,"_invocations");
      iVar14 = *(int *)(pcVar15 + 0x81ab98);
      iVar1 = local_1a0->count;
      TestCase::TestCase(pTVar10,(Context *)local_198,local_150._M_dataplus._M_p,
                         SSBOArrayLengthTests::init::arraysSized + 1);
      (pTVar10->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ConcurrentAtomicCounterCase_00a10538;
      *(int *)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode = iVar14;
      *(int *)((long)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar1;
      pTVar10[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      pTVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar10[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
      tcu::TestNode::addChild(local_c0,(TestNode *)pTVar10);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_f8);
      pcVar15 = local_188 + 4;
    }
  }
  for (local_190 = (TestNode *)0x0; local_190 != (TestNode *)0x3;
      local_190 = (TestNode *)((long)local_190 + 1)) {
    local_1a0 = init::counterInvocations + (long)local_190;
    pcVar15 = (char *)0x0;
    while (pcVar15 != (char *)0xc) {
      pTVar10 = (TestCase *)operator_new(0x98);
      RVar3 = (ReadData)(local_180->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"ssbo_atomic_counter_mixed_dispatch_",
                 (allocator<char> *)&local_d8);
      local_198 = (TestNode *)RVar3;
      local_188 = pcVar15;
      de::toString<int>(&local_128,(int *)(pcVar15 + 0x81ab98));
      std::operator+(&local_b8,&local_f8,&local_128);
      std::operator+(&local_170,&local_b8,"_calls_");
      std::operator+(&local_98,&local_170,local_1a0->name);
      std::operator+(&local_150,&local_98,"_invocations");
      iVar14 = *(int *)(pcVar15 + 0x81ab98);
      iVar1 = local_1a0->count;
      TestCase::TestCase(pTVar10,(Context *)local_198,local_150._M_dataplus._M_p,
                         SSBOArrayLengthTests::init::arraysSized + 1);
      (pTVar10->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ConcurrentSSBOAtomicCounterMixedCase_00a10588;
      *(int *)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode = iVar14;
      *(int *)((long)&pTVar10[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = iVar1;
      *(undefined4 *)&pTVar10[1].super_TestCase.super_TestNode.m_testCtx = 0;
      pTVar10[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
      pTVar10[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
      tcu::TestNode::addChild(local_c0,(TestNode *)pTVar10);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_f8);
      pcVar15 = local_188 + 4;
    }
  }
  return 3;
}

Assistant:

void SynchronizationTests::init (void)
{
	tcu::TestCaseGroup* const inInvocationGroup		= new tcu::TestCaseGroup(m_testCtx, "in_invocation",	"Test intra-invocation synchronization");
	tcu::TestCaseGroup* const interInvocationGroup	= new tcu::TestCaseGroup(m_testCtx, "inter_invocation", "Test inter-invocation synchronization");
	tcu::TestCaseGroup* const interCallGroup		= new tcu::TestCaseGroup(m_testCtx, "inter_call",       "Test inter-call synchronization");

	addChild(inInvocationGroup);
	addChild(interInvocationGroup);
	addChild(interCallGroup);

	// .in_invocation & .inter_invocation
	{
		static const struct CaseConfig
		{
			const char*									namePrefix;
			const InterInvocationTestCase::StorageType	storage;
			const int									flags;
		} configs[] =
		{
			{ "image",			InterInvocationTestCase::STORAGE_IMAGE,		0										},
			{ "image_atomic",	InterInvocationTestCase::STORAGE_IMAGE,		InterInvocationTestCase::FLAG_ATOMIC	},
			{ "ssbo",			InterInvocationTestCase::STORAGE_BUFFER,	0										},
			{ "ssbo_atomic",	InterInvocationTestCase::STORAGE_BUFFER,	InterInvocationTestCase::FLAG_ATOMIC	},
		};

		for (int groupNdx = 0; groupNdx < 2; ++groupNdx)
		{
			tcu::TestCaseGroup* const	targetGroup	= (groupNdx == 0) ? (inInvocationGroup) : (interInvocationGroup);
			const int					extraFlags	= (groupNdx == 0) ? (0) : (InterInvocationTestCase::FLAG_IN_GROUP);

			for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
			{
				const char* const target = (configs[configNdx].storage == InterInvocationTestCase::STORAGE_BUFFER) ? ("buffer") : ("image");

				targetGroup->addChild(new InvocationWriteReadCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_write_read").c_str(),
																  (std::string("Write to ") + target + " and read it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationReadWriteCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_read_write").c_str(),
																  (std::string("Read form ") + target + " and then write to it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationOverWriteCase(m_context,
																  (std::string(configs[configNdx].namePrefix) + "_overwrite").c_str(),
																  (std::string("Write to ") + target + " twice and read it").c_str(),
																  configs[configNdx].storage,
																  configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationAliasWriteCase(m_context,
																   (std::string(configs[configNdx].namePrefix) + "_alias_write").c_str(),
																   (std::string("Write to aliasing ") + target + " and read it").c_str(),
																   InvocationAliasWriteCase::TYPE_WRITE,
																   configs[configNdx].storage,
																   configs[configNdx].flags | extraFlags));

				targetGroup->addChild(new InvocationAliasWriteCase(m_context,
																   (std::string(configs[configNdx].namePrefix) + "_alias_overwrite").c_str(),
																   (std::string("Write to aliasing ") + target + "s and read it").c_str(),
																   InvocationAliasWriteCase::TYPE_OVERWRITE,
																   configs[configNdx].storage,
																   configs[configNdx].flags | extraFlags));
			}
		}
	}

	// .inter_call
	{
		tcu::TestCaseGroup* const withBarrierGroup		= new tcu::TestCaseGroup(m_testCtx, "with_memory_barrier", "Synchronize with memory barrier");
		tcu::TestCaseGroup* const withoutBarrierGroup	= new tcu::TestCaseGroup(m_testCtx, "without_memory_barrier", "Synchronize without memory barrier");

		interCallGroup->addChild(withBarrierGroup);
		interCallGroup->addChild(withoutBarrierGroup);

		// .with_memory_barrier
		{
			static const struct CaseConfig
			{
				const char*								namePrefix;
				const InterCallTestCase::StorageType	storage;
				const int								flags;
			} configs[] =
			{
				{ "image",			InterCallTestCase::STORAGE_IMAGE,	0																		},
				{ "image_atomic",	InterCallTestCase::STORAGE_IMAGE,	InterCallTestCase::FLAG_USE_ATOMIC | InterCallTestCase::FLAG_USE_INT	},
				{ "ssbo",			InterCallTestCase::STORAGE_BUFFER,	0																		},
				{ "ssbo_atomic",	InterCallTestCase::STORAGE_BUFFER,	InterCallTestCase::FLAG_USE_ATOMIC | InterCallTestCase::FLAG_USE_INT	},
			};

			const int seed0 = 123;
			const int seed1 = 457;

			for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
			{
				const char* const target = (configs[configNdx].storage == InterCallTestCase::STORAGE_BUFFER) ? ("buffer") : ("image");

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_write_read").c_str(),
																 (std::string("Write to ") + target + " and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed0)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_read_write").c_str(),
																 (std::string("Read from ") + target + " and then write to it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::ReadZeroData::Generate(1)
																	<< op::Barrier()
																	<< op::WriteData::Generate(1, seed0)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_overwrite").c_str(),
																 (std::string("Write to ") + target + " twice and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::Barrier()
																	<< op::WriteData::Generate(1, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_write_read").c_str(),
																 (std::string("Write to multiple ") + target + "s and read them").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadMultipleData::Generate(1, seed0, 2, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_interleaved_write_read").c_str(),
																 (std::string("Write to same ") + target + " in multiple calls and read it").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteDataInterleaved::Generate(1, seed0, true)
																	<< op::WriteDataInterleaved::Generate(1, seed1, false)
																	<< op::Barrier()
																	<< op::ReadDataInterleaved::Generate(1, seed0, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_unrelated_write_read_ordered").c_str(),
																 (std::string("Two unrelated ") + target + " write-reads").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(1, seed0)
																	<< op::ReadData::Generate(2, seed1)));

				withBarrierGroup->addChild(new InterCallTestCase(m_context,
																 (std::string(configs[configNdx].namePrefix) + "_multiple_unrelated_write_read_non_ordered").c_str(),
																 (std::string("Two unrelated ") + target + " write-reads").c_str(),
																 configs[configNdx].storage,
																 configs[configNdx].flags,
																 InterCallOperations()
																	<< op::WriteData::Generate(1, seed0)
																	<< op::WriteData::Generate(2, seed1)
																	<< op::Barrier()
																	<< op::ReadData::Generate(2, seed1)
																	<< op::ReadData::Generate(1, seed0)));
			}

			// .without_memory_barrier
			{
				struct InvocationConfig
				{
					const char*	name;
					int			count;
				};

				static const InvocationConfig ssboInvocations[] =
				{
					{ "1k",		1024	},
					{ "4k",		4096	},
					{ "32k",	32768	},
				};
				static const InvocationConfig imageInvocations[] =
				{
					{ "8x8",		8	},
					{ "32x32",		32	},
					{ "128x128",	128	},
				};
				static const InvocationConfig counterInvocations[] =
				{
					{ "32",		32		},
					{ "128",	128		},
					{ "1k",		1024	},
				};
				static const int callCounts[] = { 2, 5, 100 };

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(ssboInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new SSBOConcurrentAtomicCase(m_context, (std::string("ssbo_atomic_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + ssboInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], ssboInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(imageInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentImageAtomicCase(m_context, (std::string("image_atomic_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + imageInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], imageInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(counterInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentAtomicCounterCase(m_context, (std::string("atomic_counter_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + counterInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], counterInvocations[invocationNdx].count));

				for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(counterInvocations); ++invocationNdx)
					for (int callCountNdx = 0; callCountNdx < DE_LENGTH_OF_ARRAY(callCounts); ++callCountNdx)
						withoutBarrierGroup->addChild(new ConcurrentSSBOAtomicCounterMixedCase(m_context, (std::string("ssbo_atomic_counter_mixed_dispatch_") + de::toString(callCounts[callCountNdx]) + "_calls_" + counterInvocations[invocationNdx].name + "_invocations").c_str(),	"", callCounts[callCountNdx], counterInvocations[invocationNdx].count));
			}
		}
	}
}